

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::TcParser::MpVerifyUtf8
          (TcParser *this,string_view wire_bytes,TcParseTableBase *table,FieldEntry *entry,
          uint16_t xform_val)

{
  char cVar1;
  undefined1 unaff_BL;
  bool bVar2;
  string_view message_name;
  string_view sVar3;
  string_view sVar4;
  string_view field_name;
  
  if ((int)entry == 0x200) {
    cVar1 = utf8_range::IsStructurallyValid(this,wire_bytes._M_len);
    bVar2 = true;
    if (cVar1 != '\0') {
      return true;
    }
  }
  else {
    if ((int)entry != 0x400) {
      return true;
    }
    cVar1 = utf8_range::IsStructurallyValid(this,wire_bytes._M_len);
    if (cVar1 != '\0') {
      return true;
    }
    bVar2 = false;
  }
  sVar3 = MessageName((TcParseTableBase *)wire_bytes._M_str);
  sVar4 = FieldName((TcParseTableBase *)wire_bytes._M_str,(FieldEntry *)table);
  message_name._M_str = (char *)sVar4._M_len;
  message_name._M_len = (size_t)sVar3._M_str;
  field_name._M_str = "parsing";
  field_name._M_len = (size_t)sVar4._M_str;
  PrintUTF8ErrorLog((internal *)sVar3._M_len,message_name,field_name,(char *)0x0,(bool)unaff_BL);
  return bVar2;
}

Assistant:

bool TcParser::MpVerifyUtf8(absl::string_view wire_bytes,
                            const TcParseTableBase* table,
                            const FieldEntry& entry, uint16_t xform_val) {
  if (xform_val == field_layout::kTvUtf8) {
    if (!utf8_range::IsStructurallyValid(wire_bytes)) {
      PrintUTF8ErrorLog(MessageName(table), FieldName(table, &entry), "parsing",
                        false);
      return false;
    }
    return true;
  }
#ifndef NDEBUG
  if (xform_val == field_layout::kTvUtf8Debug) {
    if (!utf8_range::IsStructurallyValid(wire_bytes)) {
      PrintUTF8ErrorLog(MessageName(table), FieldName(table, &entry), "parsing",
                        false);
    }
  }
#endif  // NDEBUG
  return true;
}